

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPRThreaTest.cpp
# Opt level: O0

void printInt(int num)

{
  ostream *poVar1;
  int in_EDI;
  int i;
  int local_8;
  
  for (local_8 = 0; local_8 < 2; local_8 = local_8 + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,"num: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_EDI);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    sleep(1);
  }
  return;
}

Assistant:

void printInt(int num)
{
    for(int i=0;i<2;++i)
    {
        std::cout << "num: " << num << std::endl;
        ::sleep(1);
    }
}